

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandTestCex(Abc_Frame_t *pAbc,int argc,char **argv)

{
  uint uVar1;
  Abc_Cex_t *pAVar2;
  Gia_Man_t *pAig;
  bool bVar3;
  int iVar4;
  uint nOutputs;
  Abc_Ntk_t *pNtk;
  uint uVar5;
  char *pcVar6;
  int iVar7;
  
  nOutputs = 0;
  Extra_UtilGetoptReset();
  bVar3 = true;
  do {
    while (iVar4 = Extra_UtilGetopt(argc,argv,"Oah"), iVar7 = globalUtilOptind, iVar4 != 0x4f) {
      if (iVar4 == -1) {
        pAVar2 = pAbc->pCex;
        if (pAVar2 == (Abc_Cex_t *)0x0) {
          pcVar6 = "There is no current cex.\n";
        }
        else if (bVar3) {
          pAig = pAbc->pGia;
          if (pAig == (Gia_Man_t *)0x0) {
            pcVar6 = "And  AIG: There is no current network.\n";
          }
          else {
            uVar5 = pAig->vCis->nSize - pAig->nRegs;
            uVar1 = pAVar2->nPis;
            if (uVar5 != uVar1) {
              pcVar6 = "And  AIG: The number of PIs (%d) is different from cex (%d).\n";
LAB_002739be:
              Abc_Print(1,pcVar6,(ulong)uVar5,(ulong)uVar1);
              return 0;
            }
            uVar1 = pAVar2->iPo;
            uVar5 = Gia_ManFindFailedPoCex(pAig,pAVar2,nOutputs);
            pAbc->pCex->iPo = uVar5;
            if (uVar5 == 0xffffffff) {
              pcVar6 = "And  AIG: The cex does not fail any outputs.\n";
            }
            else {
              if (uVar1 != uVar5) {
                pcVar6 = "And  AIG: The cex refined PO %d instead of PO %d.\n";
                goto LAB_002739be;
              }
              pcVar6 = "And  AIG: The cex is correct.\n";
            }
          }
        }
        else {
          pNtk = Abc_FrameReadNtk(pAbc);
          if (pNtk == (Abc_Ntk_t *)0x0) {
            pcVar6 = "Main AIG: There is no current network.\n";
          }
          else if (pNtk->ntkType == ABC_NTK_STRASH) {
            uVar5 = pNtk->vPis->nSize;
            pAVar2 = pAbc->pCex;
            uVar1 = pAVar2->nPis;
            if (uVar5 != uVar1) {
              pcVar6 = "Main AIG: The number of PIs (%d) is different from cex (%d).\n";
              goto LAB_002739be;
            }
            uVar1 = pAVar2->iPo;
            uVar5 = Abc_NtkVerifyCex(pNtk,pAVar2);
            pAbc->pCex->iPo = uVar5;
            if (uVar5 == 0xffffffff) {
              pcVar6 = "Main AIG: The cex does not fail any outputs.\n";
            }
            else {
              if (uVar1 != uVar5) {
                pcVar6 = "Main AIG: The cex refined PO %d instead of PO %d.\n";
                goto LAB_002739be;
              }
              pcVar6 = "Main AIG: The cex is correct.\n";
            }
          }
          else {
            pcVar6 = "Main AIG: The current network is not an AIG.\n";
          }
        }
        Abc_Print(1,pcVar6);
        return 0;
      }
      if (iVar4 != 0x61) {
        if (iVar4 != 0x68) {
          pcVar6 = "Unknown switch.\n";
          iVar7 = -2;
LAB_0027385f:
          Abc_Print(iVar7,pcVar6);
        }
        goto LAB_00273866;
      }
      bVar3 = (bool)(bVar3 ^ 1);
    }
    if (argc <= globalUtilOptind) {
      pcVar6 = "Command line switch \"-O\" should be followed by an integer.\n";
      iVar7 = -1;
      goto LAB_0027385f;
    }
    nOutputs = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar7 + 1;
  } while (-1 < (int)nOutputs);
LAB_00273866:
  Abc_Print(-2,"usage: testcex [-O num] [-ah]\n");
  Abc_Print(-2,"\t         tests the current cex against the current AIG or the &-AIG\n");
  Abc_Print(-2,"\t-O num : the number of real POs in the PO list [default = %d]\n",(ulong)nOutputs);
  pcVar6 = "&-AIG";
  if (!bVar3) {
    pcVar6 = "current AIG";
  }
  Abc_Print(-2,"\t-a     : toggle checking the current AIG or the &-AIG [default = %s]\n",pcVar6);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandTestCex( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk;
    int c;
    int nOutputs = 0;
    int fCheckAnd = 1;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Oah" ) ) != EOF )
    {
        switch ( c )
        {
        case 'O':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-O\" should be followed by an integer.\n" );
                goto usage;
            }
            nOutputs = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nOutputs < 0 )
                goto usage;
            break;
        case 'a':
            fCheckAnd ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            Abc_Print( -2, "Unknown switch.\n");
            goto usage;
        }
    }

    if ( pAbc->pCex == NULL )
    {
        Abc_Print( 1, "There is no current cex.\n");
        return 0;
    }

    if ( !fCheckAnd )
    {
        // check the main AIG
        pNtk = Abc_FrameReadNtk(pAbc);
        if ( pNtk == NULL )
            Abc_Print( 1, "Main AIG: There is no current network.\n");
        else if ( !Abc_NtkIsStrash(pNtk) )
            Abc_Print( 1, "Main AIG: The current network is not an AIG.\n");
        else if ( Abc_NtkPiNum(pNtk) != pAbc->pCex->nPis )
            Abc_Print( 1, "Main AIG: The number of PIs (%d) is different from cex (%d).\n", Abc_NtkPiNum(pNtk), pAbc->pCex->nPis );
        else
        {
            extern int Abc_NtkVerifyCex( Abc_Ntk_t * pNtk, Abc_Cex_t * p );
            int iPoOld = pAbc->pCex->iPo;
            pAbc->pCex->iPo = Abc_NtkVerifyCex( pNtk, pAbc->pCex );
            if ( pAbc->pCex->iPo == -1 )
                Abc_Print( 1, "Main AIG: The cex does not fail any outputs.\n" );
            else if ( iPoOld != pAbc->pCex->iPo )
                Abc_Print( 1, "Main AIG: The cex refined PO %d instead of PO %d.\n", pAbc->pCex->iPo, iPoOld );
            else
                Abc_Print( 1, "Main AIG: The cex is correct.\n" );
        }
    }
    else
    {
        // check the AND AIG
        if ( pAbc->pGia == NULL )
            Abc_Print( 1, "And  AIG: There is no current network.\n");
        else if ( Gia_ManPiNum(pAbc->pGia) != pAbc->pCex->nPis )
            Abc_Print( 1, "And  AIG: The number of PIs (%d) is different from cex (%d).\n", Gia_ManPiNum(pAbc->pGia), pAbc->pCex->nPis );
        else
        {
            int iPoOld = pAbc->pCex->iPo;
            pAbc->pCex->iPo = Gia_ManFindFailedPoCex( pAbc->pGia, pAbc->pCex, nOutputs );
            if ( pAbc->pCex->iPo == -1 )
                Abc_Print( 1, "And  AIG: The cex does not fail any outputs.\n" );
            else if ( iPoOld != pAbc->pCex->iPo )
                Abc_Print( 1, "And  AIG: The cex refined PO %d instead of PO %d.\n", pAbc->pCex->iPo, iPoOld );
            else
                Abc_Print( 1, "And  AIG: The cex is correct.\n" );
        }
    }
    return 0;

usage:
    Abc_Print( -2, "usage: testcex [-O num] [-ah]\n" );
    Abc_Print( -2, "\t         tests the current cex against the current AIG or the &-AIG\n" );
    Abc_Print( -2, "\t-O num : the number of real POs in the PO list [default = %d]\n", nOutputs );
    Abc_Print( -2, "\t-a     : toggle checking the current AIG or the &-AIG [default = %s]\n", fCheckAnd ? "&-AIG": "current AIG" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}